

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O1

void mbedtls_debug_printf_ecdh
               (mbedtls_ssl_context *ssl,int level,char *file,int line,mbedtls_ecdh_context *ecdh,
               mbedtls_debug_ecdh_attr attr)

{
  mbedtls_ecp_point *X;
  char *text;
  
  if (attr == MBEDTLS_DEBUG_ECDH_Z) {
    mbedtls_debug_print_mpi(ssl,level,file,line,"ECDH: z",&(ecdh->ctx).mbed_ecdh.z);
    return;
  }
  if (attr == MBEDTLS_DEBUG_ECDH_QP) {
    X = &(ecdh->ctx).mbed_ecdh.Qp;
    text = "ECDH: Qp";
  }
  else {
    if (attr != MBEDTLS_DEBUG_ECDH_Q) {
      return;
    }
    X = &(ecdh->ctx).mbed_ecdh.Q;
    text = "ECDH: Q";
  }
  mbedtls_debug_print_ecp(ssl,level,file,line,text,X);
  return;
}

Assistant:

void mbedtls_debug_printf_ecdh(const mbedtls_ssl_context *ssl, int level,
                               const char *file, int line,
                               const mbedtls_ecdh_context *ecdh,
                               mbedtls_debug_ecdh_attr attr)
{
#if defined(MBEDTLS_ECDH_LEGACY_CONTEXT)
    mbedtls_debug_printf_ecdh_internal(ssl, level, file, line, ecdh, attr);
#else
    switch (ecdh->var) {
        default:
            mbedtls_debug_printf_ecdh_internal(ssl, level, file, line, ecdh,
                                               attr);
    }
#endif
}